

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkQueryUtil.cpp
# Opt level: O3

bool vk::isCompatible(VkLayerProperties *layerProperties,RequiredLayer *required)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = std::__cxx11::string::compare((char *)required);
  if ((((iVar3 == 0) &&
       ((puVar1 = (required->minSpecVersion).m_ptr, puVar1 == (uint *)0x0 ||
        (*puVar1 <= layerProperties->specVersion)))) &&
      ((puVar1 = (required->maxSpecVersion).m_ptr, puVar1 == (uint *)0x0 ||
       (layerProperties->specVersion <= *puVar1)))) &&
     (((puVar1 = (required->minImplVersion).m_ptr, puVar1 == (uint *)0x0 ||
       (*puVar1 <= layerProperties->implementationVersion)) &&
      ((puVar1 = (required->maxImplVersion).m_ptr, puVar1 == (uint *)0x0 ||
       (layerProperties->implementationVersion <= *puVar1)))))) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool isCompatible (const VkLayerProperties& layerProperties, const RequiredLayer& required)
{
	if (required.name != layerProperties.layerName)
		return false;

	if (required.minSpecVersion && required.minSpecVersion.get() > layerProperties.specVersion)
		return false;

	if (required.maxSpecVersion && required.maxSpecVersion.get() < layerProperties.specVersion)
		return false;

	if (required.minImplVersion && required.minImplVersion.get() > layerProperties.implementationVersion)
		return false;

	if (required.maxImplVersion && required.maxImplVersion.get() < layerProperties.implementationVersion)
		return false;

	return true;
}